

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWITypes.cpp
# Opt level: O1

U8 __thiscall SWI_WaveParser::GetByte(SWI_WaveParser *this,U64 *smplBegin,U64 *smplEnd,bool *isWake)

{
  SWI_Token SVar1;
  int iVar2;
  byte bVar3;
  U64 locBegin;
  U64 local_40;
  bool *local_38;
  
  *isWake = false;
  iVar2 = 8;
  bVar3 = 0;
  local_38 = isWake;
  do {
    bVar3 = bVar3 >> 1;
    SVar1 = GetToken(this,&local_40,smplEnd);
    if (SVar1 == SWI_One) {
      bVar3 = bVar3 | 0x80;
    }
    else if (SVar1 == SWI_Wake) {
      *smplBegin = local_40;
      *local_38 = true;
      return '\0';
    }
    if (iVar2 == 8) {
      *smplBegin = local_40;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return bVar3;
}

Assistant:

U8 SWI_WaveParser::GetByte( U64& smplBegin, U64& smplEnd, bool& isWake )
{
    U8 ret_val = 0;
    int b;
    SWI_Token t;
    U64 locBegin;

    isWake = false;

    for( b = 0; b < 8; b++ )
    {
        ret_val >>= 1;

        t = GetToken( locBegin, smplEnd );

        if( t == SWI_One )
            ret_val |= ( 1 << 7 );
        else if( t == SWI_Wake )
        {
            smplBegin = locBegin;
            isWake = true;
            return 0;
        }

        if( b == 0 )
            smplBegin = locBegin;
    }

    return ret_val;
}